

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLDeclaration * __thiscall tinyxml2::XMLDocument::NewDeclaration(XMLDocument *this,char *str)

{
  int iVar1;
  undefined4 extraout_var;
  char *str_00;
  XMLDeclaration *pXVar2;
  
  iVar1 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
  pXVar2 = (XMLDeclaration *)CONCAT44(extraout_var,iVar1);
  (pXVar2->super_XMLNode)._document = this;
  (pXVar2->super_XMLNode)._parent = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._value._flags = 0;
  (pXVar2->super_XMLNode)._value._start = (char *)0x0;
  (pXVar2->super_XMLNode)._value._end = (char *)0x0;
  (pXVar2->super_XMLNode)._parseLineNum = 0;
  (pXVar2->super_XMLNode)._userData = (void *)0x0;
  (pXVar2->super_XMLNode)._memPool = (MemPool *)0x0;
  (pXVar2->super_XMLNode)._firstChild = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._lastChild = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._prev = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._next = (XMLNode *)0x0;
  (pXVar2->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_00115520;
  (pXVar2->super_XMLNode)._memPool = &(this->_commentPool).super_MemPool;
  str_00 = "xml version=\"1.0\" encoding=\"UTF-8\"";
  if (str != (char *)0x0) {
    str_00 = str;
  }
  StrPair::SetStr(&(pXVar2->super_XMLNode)._value,str_00,0);
  return pXVar2;
}

Assistant:

XMLDeclaration* XMLDocument::NewDeclaration( const char* str )
{
    XMLDeclaration* dec = CreateUnlinkedNode<XMLDeclaration>( _commentPool );
    dec->SetValue( str ? str : "xml version=\"1.0\" encoding=\"UTF-8\"" );
    return dec;
}